

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O1

int Bmcg_ManUnfold_rec(Bmcg_Man_t *p,int iObj,int f)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  Gia_Man_t *pGVar4;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  uint uVar8;
  uint uVar9;
  long lVar10;
  uint uVar11;
  
  if ((f < 0) || ((p->vGia2Fr).nSize <= f)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  pvVar3 = (p->vGia2Fr).pArray[(uint)f];
  iVar1 = *(int *)((long)pvVar3 + (long)iObj * 4);
  if (-1 < iVar1) {
    return iVar1;
  }
  if (-1 < iObj) {
    pGVar4 = p->pGia;
    if (iObj < pGVar4->nObjs) {
      pGVar5 = pGVar4->pObjs;
      uVar9 = (uint)*(undefined8 *)(pGVar5 + (uint)iObj);
      if ((uVar9 & 0x9fffffff) == 0x9fffffff) {
        uVar9 = (uint)((ulong)*(undefined8 *)(pGVar5 + (uint)iObj) >> 0x20);
        if ((int)(uVar9 & 0x1fffffff) < pGVar4->vCis->nSize - pGVar4->nRegs) {
          Vec_IntPush(&p->vCiMap,uVar9 & 0x1fffffff);
          Vec_IntPush(&p->vCiMap,f);
          pGVar4 = p->pFrames;
          pGVar7 = Gia_ManAppendObj(pGVar4);
          uVar6 = *(ulong *)pGVar7;
          *(ulong *)pGVar7 = uVar6 | 0x9fffffff;
          *(ulong *)pGVar7 =
               uVar6 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(pGVar4->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar5 = pGVar4->pObjs;
          if ((pGVar5 <= pGVar7) && (pGVar7 < pGVar5 + pGVar4->nObjs)) {
            Vec_IntPush(pGVar4->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar5) >> 2) * -0x55555555)
            ;
            pGVar5 = pGVar4->pObjs;
            if ((pGVar5 <= pGVar7) && (pGVar7 < pGVar5 + pGVar4->nObjs)) {
              uVar11 = (int)((ulong)((long)pGVar7 - (long)pGVar5) >> 2) * 0x55555556;
              goto LAB_0056a888;
            }
          }
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        if (f == 0) {
          uVar11 = 0;
        }
        else {
          iVar1 = pGVar4->vCis->nSize;
          if ((int)(uVar9 & 0x1fffffff) < iVar1 - pGVar4->nRegs) {
            __assert_fail("Gia_ObjIsRo(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1fd,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
          }
          iVar2 = pGVar4->vCos->nSize;
          uVar9 = (iVar2 - iVar1) + (uVar9 & 0x1fffffff);
          if (((int)uVar9 < 0) || (iVar2 <= (int)uVar9)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar1 = pGVar4->vCos->pArray[uVar9];
          lVar10 = (long)iVar1;
          if ((lVar10 < 0) || (pGVar4->nObjs <= iVar1)) goto LAB_0056a960;
          uVar11 = Bmcg_ManUnfold_rec(p,iVar1 - (*(uint *)(pGVar5 + lVar10) & 0x1fffffff),f + -1);
          if ((int)uVar11 < 0) goto LAB_0056a99e;
          uVar11 = *(uint *)(pGVar5 + lVar10) >> 0x1d & 1 ^ uVar11;
        }
      }
      else {
        if (((int)uVar9 < 0) || ((uVar9 & 0x1fffffff) == 0x1fffffff)) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmcG.c"
                        ,0xa0,"int Bmcg_ManUnfold_rec(Bmcg_Man_t *, int, int)");
        }
        uVar9 = Bmcg_ManUnfold_rec(p,iObj - (uVar9 & 0x1fffffff),f);
        if ((int)uVar9 < 0) {
LAB_0056a99e:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar6 = *(ulong *)(pGVar5 + (uint)iObj);
        uVar8 = (uint)(uVar6 >> 0x1d) & 1;
        uVar11 = uVar8 ^ uVar9;
        if (uVar8 != uVar9) {
          uVar9 = Bmcg_ManUnfold_rec(p,iObj - ((uint)(uVar6 >> 0x20) & 0x1fffffff),f);
          if ((int)uVar9 < 0) goto LAB_0056a99e;
          uVar11 = Gia_ManHashAnd(p->pFrames,uVar11,
                                  (uint)(*(ulong *)(pGVar5 + (uint)iObj) >> 0x3d) & 1 ^ uVar9);
        }
      }
LAB_0056a888:
      *(uint *)((long)pvVar3 + (long)iObj * 4) = uVar11;
      return uVar11;
    }
  }
LAB_0056a960:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

int Bmcg_ManUnfold_rec( Bmcg_Man_t * p, int iObj, int f )
{
    Gia_Obj_t * pObj; 
    int iLit = 0, * pCopies = Bmcg_ManCopies( p, f );
    if ( pCopies[iObj] >= 0 )
        return pCopies[iObj];
    pObj = Gia_ManObj( p->pGia, iObj );
    if ( Gia_ObjIsCi(pObj) )
    {
        if ( Gia_ObjIsPi(p->pGia, pObj) )
        {
            Vec_IntPushTwo( &p->vCiMap, Gia_ObjCioId(pObj), f );
            iLit = Gia_ManAppendCi( p->pFrames );
        }
        else if ( f > 0 )
        {
            pObj = Gia_ObjRoToRi( p->pGia, pObj );
            iLit = Bmcg_ManUnfold_rec( p, Gia_ObjFaninId0p(p->pGia, pObj), f-1 );
            iLit = Abc_LitNotCond( iLit, Gia_ObjFaninC0(pObj) );
        }
    }
    else if ( Gia_ObjIsAnd(pObj) )
    {
        iLit = Bmcg_ManUnfold_rec( p, Gia_ObjFaninId0(pObj, iObj), f );
        iLit = Abc_LitNotCond( iLit, Gia_ObjFaninC0(pObj) );
        if ( iLit > 0 )
        {
            int iNew;
            iNew = Bmcg_ManUnfold_rec( p, Gia_ObjFaninId1(pObj, iObj), f );
            iNew = Abc_LitNotCond( iNew, Gia_ObjFaninC1(pObj) );
            iLit = Gia_ManHashAnd( p->pFrames, iLit, iNew );
        }
    }
    else assert( 0 );
    return (pCopies[iObj] = iLit);
}